

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O0

double simdjson::internal::round(double __x)

{
  int *in_RDI;
  uint local_2c;
  bool round_up;
  uint32_t i;
  uint64_t n;
  uint32_t dp;
  decimal *h_local;
  
  if (((*in_RDI != 0) && (-1 < in_RDI[1])) && (in_RDI[1] < 0x13)) {
    for (local_2c = 0; local_2c < (uint)in_RDI[1]; local_2c = local_2c + 1) {
    }
  }
  return __x;
}

Assistant:

uint64_t round(decimal &h) {
  if ((h.num_digits == 0) || (h.decimal_point < 0)) {
    return 0;
  } else if (h.decimal_point > 18) {
    return UINT64_MAX;
  }
  // at this point, we know that h.decimal_point >= 0
  uint32_t dp = uint32_t(h.decimal_point);
  uint64_t n = 0;
  for (uint32_t i = 0; i < dp; i++) {
    n = (10 * n) + ((i < h.num_digits) ? h.digits[i] : 0);
  }
  bool round_up = false;
  if (dp < h.num_digits) {
    round_up = h.digits[dp] >= 5; // normally, we round up
    // but we may need to round to even!
    if ((h.digits[dp] == 5) && (dp + 1 == h.num_digits)) {
      round_up = h.truncated || ((dp > 0) && (1 & h.digits[dp - 1]));
    }
  }
  if (round_up) {
    n++;
  }
  return n;
}